

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O3

void splitLine(wstring *line,wstring *name,wstring *arguments)

{
  wchar_t wVar1;
  uint uVar2;
  size_type sVar3;
  pointer pwVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar7 = 0;
  std::__cxx11::wstring::_M_replace((ulong)name,0,(wchar_t *)name->_M_string_length,0x150870);
  std::__cxx11::wstring::_M_replace
            ((ulong)arguments,0,(wchar_t *)arguments->_M_string_length,0x150870);
  sVar3 = line->_M_string_length;
  uVar2 = (uint)sVar3;
  if ((int)uVar2 < 1) {
LAB_0013ddad:
    if ((int)uVar7 < (int)uVar2) {
      uVar7 = uVar7 & 0xffffffff;
      do {
        uVar2 = (uint)sVar3;
        wVar1 = (line->_M_dataplus)._M_p[uVar7];
        if (wVar1 == L'\0') {
          return;
        }
        if (wVar1 == L' ') break;
        uVar7 = uVar7 + 1;
        std::__cxx11::wstring::push_back((wchar_t)name);
        sVar3 = line->_M_string_length;
        uVar2 = (uint)sVar3;
      } while ((int)uVar7 < (int)uVar2);
    }
    uVar6 = (uint)uVar7;
    if ((int)(uint)uVar7 < (int)uVar2) {
      pwVar4 = (line->_M_dataplus)._M_p + (uVar7 & 0xffffffff);
      do {
        if ((*pwVar4 != L' ') && (uVar6 = (uint)uVar7, *pwVar4 != L'\t')) break;
        uVar5 = (uint)uVar7 + 1;
        uVar7 = (ulong)uVar5;
        pwVar4 = pwVar4 + 1;
        uVar6 = uVar2;
      } while ((int)uVar5 < (int)uVar2);
    }
  }
  else {
    uVar7 = 0;
    do {
      wVar1 = (line->_M_dataplus)._M_p[uVar7];
      if ((wVar1 != L' ') && (wVar1 != L'\t')) goto LAB_0013ddad;
      uVar7 = uVar7 + 1;
      uVar6 = uVar2;
    } while ((uVar2 & 0x7fffffff) != uVar7);
  }
  if ((int)uVar6 < (int)uVar2) {
    uVar7 = (ulong)uVar6;
    do {
      if ((line->_M_dataplus)._M_p[uVar7] == L'\0') {
        return;
      }
      uVar7 = uVar7 + 1;
      std::__cxx11::wstring::push_back((wchar_t)arguments);
    } while ((int)uVar7 < (int)line->_M_string_length);
  }
  return;
}

Assistant:

void splitLine(std::wstring& line, std::wstring& name, std::wstring& arguments)
{
	int linePos = 0;
	name = L"";
	arguments = L"";

	while (linePos < (int)line.size() && (line[linePos] == ' ' || line[linePos] == '\t')) linePos++;
	while (linePos < (int)line.size() && line[linePos] != ' ')
	{
		if (line[linePos]  == 0)
		{
			return;
		}
		name += line[linePos++];
	}
	
	while (linePos < (int)line.size() && (line[linePos] == ' ' || line[linePos] == '\t')) linePos++;

	while (linePos < (int)line.size() && line[linePos] != 0)
	{
		arguments += line[linePos++];
	}
}